

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo.cpp
# Opt level: O0

void asmjit::x86DetectCpuInfo(CpuInfo *cpuInfo)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  anon_union_4_2_424c626f_for_ArchInfo_0 aVar5;
  uint uVar6;
  anon_union_4_2_424c626f_for_ArchInfo_0 aVar7;
  uint uVar8;
  uint *puVar9;
  ArchInfo *pAVar10;
  anon_union_4_2_424c626f_for_ArchInfo_0 *paVar11;
  ArchInfo *in_RDI;
  uint in_XCR0;
  uint32_t *brand;
  uint32_t kHighestProcessedEAX;
  bool maybeMPX;
  XGetBVResult xcr0;
  CpuIdResult regs;
  uint32_t maxId;
  uint32_t i;
  uint32_t i_1;
  uint32_t dw2;
  uint32_t dw1;
  uint32_t dw0;
  uint32_t outEdx;
  uint32_t outEax;
  char curr;
  char prev;
  char *d;
  uint32_t bit;
  uint32_t idx;
  uint32_t bit_1;
  uint32_t idx_1;
  uint32_t bit_2;
  uint32_t idx_2;
  uint32_t bit_3;
  uint32_t idx_3;
  uint32_t bit_4;
  uint32_t idx_4;
  uint32_t bit_5;
  uint32_t idx_5;
  uint32_t bit_6;
  uint32_t idx_6;
  uint32_t bit_7;
  uint32_t idx_7;
  uint32_t bit_8;
  uint32_t idx_8;
  uint32_t bit_9;
  uint32_t idx_9;
  uint32_t bit_10;
  uint32_t idx_10;
  uint32_t bit_11;
  uint32_t idx_11;
  uint32_t bit_12;
  uint32_t idx_12;
  uint32_t bit_13;
  uint32_t idx_13;
  uint32_t bit_14;
  uint32_t idx_14;
  uint32_t bit_15;
  uint32_t idx_15;
  uint32_t bit_16;
  uint32_t idx_16;
  uint32_t bit_17;
  uint32_t idx_17;
  uint32_t bit_18;
  uint32_t idx_18;
  uint32_t bit_19;
  uint32_t idx_19;
  uint32_t bit_20;
  uint32_t idx_20;
  uint32_t bit_21;
  uint32_t idx_21;
  uint32_t bit_22;
  uint32_t idx_22;
  uint32_t bit_23;
  uint32_t idx_23;
  uint32_t bit_24;
  uint32_t idx_24;
  uint32_t bit_25;
  uint32_t idx_25;
  uint32_t bit_26;
  uint32_t idx_26;
  uint32_t bit_27;
  uint32_t idx_27;
  uint32_t bit_28;
  uint32_t idx_28;
  uint32_t bit_29;
  uint32_t idx_29;
  uint32_t bit_30;
  uint32_t idx_30;
  uint32_t bit_31;
  uint32_t idx_31;
  uint32_t bit_32;
  uint32_t idx_32;
  uint32_t bit_33;
  uint32_t idx_33;
  uint32_t bit_34;
  uint32_t idx_34;
  uint32_t bit_35;
  uint32_t idx_35;
  uint32_t bit_36;
  uint32_t idx_36;
  uint32_t bit_37;
  uint32_t idx_37;
  uint32_t bit_38;
  uint32_t idx_38;
  uint32_t bit_39;
  uint32_t idx_39;
  uint32_t bit_40;
  uint32_t idx_40;
  uint32_t bit_41;
  uint32_t idx_41;
  uint32_t bit_42;
  uint32_t idx_42;
  uint32_t bit_43;
  uint32_t idx_43;
  uint32_t bit_44;
  uint32_t idx_44;
  uint32_t bit_46;
  uint32_t idx_46;
  uint32_t bit_47;
  uint32_t idx_47;
  uint32_t bit_48;
  uint32_t idx_48;
  uint32_t bit_49;
  uint32_t idx_49;
  uint32_t bit_50;
  uint32_t idx_50;
  uint32_t bit_51;
  uint32_t idx_51;
  uint32_t bit_52;
  uint32_t idx_52;
  uint32_t bit_53;
  uint32_t idx_53;
  uint32_t bit_54;
  uint32_t idx_54;
  uint32_t bit_55;
  uint32_t idx_55;
  uint32_t bit_56;
  uint32_t idx_56;
  uint32_t bit_57;
  uint32_t idx_57;
  uint32_t bit_58;
  uint32_t idx_58;
  uint32_t bit_59;
  uint32_t idx_59;
  uint32_t bit_60;
  uint32_t idx_60;
  uint32_t bit_61;
  uint32_t idx_61;
  uint32_t bit_62;
  uint32_t idx_62;
  uint32_t bit_63;
  uint32_t idx_63;
  uint32_t bit_64;
  uint32_t idx_64;
  uint32_t bit_65;
  uint32_t idx_65;
  uint32_t bit_66;
  uint32_t idx_66;
  uint32_t bit_67;
  uint32_t idx_67;
  uint32_t bit_68;
  uint32_t idx_68;
  uint32_t bit_69;
  uint32_t idx_69;
  uint32_t bit_70;
  uint32_t idx_70;
  uint32_t bit_71;
  uint32_t idx_71;
  uint32_t bit_72;
  uint32_t idx_72;
  uint32_t bit_73;
  uint32_t idx_73;
  uint32_t bit_74;
  uint32_t idx_74;
  uint32_t bit_75;
  uint32_t idx_75;
  uint32_t bit_77;
  uint32_t idx_77;
  uint32_t bit_78;
  uint32_t idx_78;
  uint32_t bit_79;
  uint32_t idx_79;
  uint32_t bit_80;
  uint32_t idx_80;
  uint32_t bit_45;
  uint32_t idx_45;
  uint32_t bit_76;
  uint32_t idx_76;
  anon_union_4_2_424c626f_for_ArchInfo_0 *local_d90;
  uint local_d88;
  bool local_d81;
  uint local_d80 [2];
  uint local_d78 [4];
  uint local_d68;
  uint local_d64;
  ArchInfo *local_d60;
  undefined4 local_d54;
  ArchInfo *local_d50;
  undefined4 local_d44;
  ArchInfo *local_d40;
  undefined4 local_d34;
  ArchInfo *local_d30;
  undefined4 local_d24;
  ArchInfo *local_d20;
  undefined4 local_d14;
  ArchInfo *local_d10;
  undefined4 local_d04;
  ArchInfo *local_d00;
  undefined4 local_cf4;
  ArchInfo *local_cf0;
  undefined4 local_ce4;
  ArchInfo *local_ce0;
  undefined4 local_cd4;
  uint local_808;
  anon_union_4_2_424c626f_for_ArchInfo_0 local_7f0;
  uint8_t local_7aa;
  uint8_t local_7a9;
  ArchInfo *local_7a8;
  ArchInfo *local_7a0;
  
  local_d60 = in_RDI;
  memset(local_d80,0,8);
  ArchInfo::init(local_d60,(EVP_PKEY_CTX *)0x2);
  *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 2;
  puVar9 = (uint *)cpuid_basic_info(0);
  uVar2 = *puVar9;
  aVar5 = *(anon_union_4_2_424c626f_for_ArchInfo_0 *)(puVar9 + 2);
  aVar7 = *(anon_union_4_2_424c626f_for_ArchInfo_0 *)(puVar9 + 3);
  local_d60[10].field_0 = *(anon_union_4_2_424c626f_for_ArchInfo_0 *)(puVar9 + 1);
  local_d60[0xb].field_0 = aVar5;
  local_d60[0xc].field_0 = aVar7;
  local_808 = 0;
  do {
    if (3 < local_808) {
      local_7f0._signature = 0;
LAB_0029904c:
      local_d60[1].field_0 = local_7f0;
      if (uVar2 != 0) {
        puVar9 = (uint *)cpuid_Version_info(1);
        uVar3 = *puVar9;
        uVar4 = puVar9[1];
        uVar6 = puVar9[2];
        uVar8 = puVar9[3];
        local_d60[2].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar3 >> 8 & 0xf);
        local_d60[3].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar3 >> 4 & 0xf);
        local_d60[4].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar3 & 0xf);
        if (local_d60[2].field_0._signature == 0xf) {
          local_d60[2].field_0 =
               (anon_union_4_2_424c626f_for_ArchInfo_0)
               ((uVar3 >> 0x14 & 0xff) + local_d60[2].field_0._signature);
          local_d60[3].field_0 =
               (anon_union_4_2_424c626f_for_ArchInfo_0)
               ((uVar3 >> 0x10 & 0xf) * 0x10 + local_d60[3].field_0._signature);
        }
        local_d60[0x1e].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar3 >> 0xc & 3);
        local_d60[0x1f].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar4 & 0xff);
        local_d60[0x20].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)((uVar4 >> 8 & 0xff) << 3)
        ;
        local_d60[0x21].field_0 = (anon_union_4_2_424c626f_for_ArchInfo_0)(uVar4 >> 0x10 & 0xff);
        if ((uVar8 & 1) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x10000000;
        }
        if ((uVar8 & 2) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x8000000000;
        }
        if ((uVar8 & 8) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x400000000;
        }
        if ((uVar8 & 0x200) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x20000000;
        }
        if ((uVar8 & 0x2000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x80;
        }
        if ((uVar8 & 0x80000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x80000000;
        }
        if ((uVar8 & 0x100000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x100000000;
        }
        if ((uVar8 & 0x400000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x800000000;
        }
        if ((uVar8 & 0x800000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x1000000000;
        }
        if ((uVar8 & 0x2000000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x4000000000;
        }
        if ((uVar8 & 0x4000000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x200000000000;
        }
        if ((uVar8 & 0x8000000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x2000000000000;
        }
        if ((uVar8 & 0x40000000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x10000000000;
        }
        if ((uVar6 & 0x10) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x200;
        }
        if ((uVar6 & 0x20) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x100;
        }
        if ((uVar6 & 0x100) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x40;
        }
        if ((uVar6 & 0x8000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x20;
        }
        if ((uVar6 & 0x80000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x800;
        }
        if ((uVar6 & 0x800000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x200000;
        }
        if ((uVar6 & 0x1000000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x80000;
        }
        if ((uVar6 & 0x2000000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x4000000;
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x400000;
        }
        if ((uVar6 & 0x4000000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x4000000;
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x8000000;
        }
        if ((uVar6 & 0x10000000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 8;
        }
        if ((uVar8 & 0xc000000) == 0xc000000) {
          local_d80[0] = in_XCR0;
        }
        if (((uVar8 & 0x10000000) != 0) && ((local_d80[0] & 6) == 6)) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x4000000000000;
          if ((uVar8 & 0x1000) != 0) {
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x20000000000000;
          }
          if ((uVar8 & 0x20000000) != 0) {
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x10000000000000;
          }
        }
      }
      local_d81 = false;
      if (6 < uVar2) {
        lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
        uVar3 = *(uint *)(lVar1 + 4);
        uVar4 = *(uint *)(lVar1 + 8);
        uVar6 = *(uint *)(lVar1 + 0xc);
        if ((uVar3 & 1) != 0) {
          *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 2;
        }
        if ((uVar3 & 8) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x100000000000000;
        }
        if ((uVar3 & 0x10) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x2000000000000000;
        }
        if ((uVar3 & 0x80) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x80000000000;
        }
        if ((uVar3 & 0x100) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x200000000000000;
        }
        if ((uVar3 & 0x200) != 0) {
          *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 1;
        }
        if ((uVar3 & 0x800) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x4000000000000000;
        }
        local_d81 = (uVar3 & 0x4000) != 0;
        if ((uVar3 & 0x40000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x20000000000;
        }
        if ((uVar3 & 0x80000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x400000000000000;
        }
        if ((uVar3 & 0x100000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x40000000000;
        }
        if ((uVar3 & 0x400000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x8000;
        }
        if ((uVar3 & 0x800000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x1000;
        }
        if ((uVar3 & 0x1000000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x2000;
        }
        if ((uVar3 & 0x20000000) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x100000000000;
        }
        if ((uVar6 & 1) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x20000;
        }
        if ((uVar3 & 0x810) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x8000000000000000;
        }
        if (((*(ulong *)(local_d60 + 6) >> 0x32 & 1) != 0) && ((uVar3 & 0x20) != 0)) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x8000000000000;
        }
        if (((uVar3 & 0x10000) != 0) && ((local_d80[0] & 0xe6) == 0xe6)) {
          *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 4;
          if ((uVar3 & 0x20000) != 0) {
            *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 0x40;
          }
          if ((uVar3 & 0x200000) != 0) {
            *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 0x200;
          }
          if ((uVar3 & 0x4000000) != 0) {
            *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 0x10;
          }
          if ((uVar3 & 0x8000000) != 0) {
            *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 0x20;
          }
          if ((uVar3 & 0x10000000) != 0) {
            *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 8;
          }
          if ((uVar3 & 0x40000000) != 0) {
            *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 0x80;
          }
          if ((uVar3 & 0x80000000) != 0) {
            *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 0x100;
          }
          if ((uVar6 & 2) != 0) {
            *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 0x400;
          }
          if ((uVar6 & 0x4000) != 0) {
            *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 0x800;
          }
          if ((uVar4 & 4) != 0) {
            *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 0x1000;
          }
          if ((uVar4 & 8) != 0) {
            *(ulong *)(local_d60 + 8) = *(ulong *)(local_d60 + 8) | 0x2000;
          }
        }
      }
      if (0xc < uVar2) {
        puVar9 = (uint *)cpuid_Processor_Extended_States_info(0xd);
        if (((*puVar9 & local_d80[0] & 0x18) == 0x18) && (local_d81 != false)) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x1000000000000000;
        }
        puVar9 = (uint *)cpuid_Processor_Extended_States_info(0xd);
        uVar2 = *puVar9;
        if ((uVar2 & 1) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x1000000000000;
        }
        if ((uVar2 & 2) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x400000000000;
        }
        if ((uVar2 & 8) != 0) {
          *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x800000000000;
        }
      }
      local_d88 = 0x80000008;
      local_d90 = &local_d60[0xe].field_0;
      local_d68 = 0x80000000;
      local_d64 = 0x80000000;
      do {
        if (local_d64 == 0) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_basic_info(0);
        }
        else if (local_d64 == 1) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Version_info(1);
        }
        else if (local_d64 == 2) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_cache_tlb_info(2);
        }
        else if (local_d64 == 3) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_serial_info(3);
        }
        else if (local_d64 == 4) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                    cpuid_Deterministic_Cache_Parameters_info(4);
        }
        else if (local_d64 == 5) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_MONITOR_MWAIT_Features_info(5);
        }
        else if (local_d64 == 6) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Thermal_Power_Management_info(6)
          ;
        }
        else if (local_d64 == 7) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                    cpuid_Extended_Feature_Enumeration_info(7);
        }
        else if (local_d64 == 9) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Direct_Cache_Access_info(9);
        }
        else if (local_d64 == 10) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                    cpuid_Architectural_Performance_Monitoring_info(10);
        }
        else if (local_d64 == 0xb) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Extended_Topology_info(0xb);
        }
        else if (local_d64 == 0xd) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)
                    cpuid_Processor_Extended_States_info(0xd);
        }
        else if (local_d64 == 0xf) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_Quality_of_Service_info(0xf);
        }
        else if (local_d64 == 0x80000002) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_brand_part1_info(0x80000002);
        }
        else if (local_d64 == 0x80000003) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_brand_part2_info(0x80000003);
        }
        else if (local_d64 == 0x80000004) {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid_brand_part3_info(0x80000004);
        }
        else {
          paVar11 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)cpuid(local_d64);
        }
        uVar2 = paVar11[1]._signature;
        uVar3 = paVar11[2]._signature;
        uVar4 = paVar11[3]._signature;
        switch(local_d64) {
        case 0x80000000:
          puVar9 = std::min<unsigned_int>(local_d78,&local_d88);
          local_d68 = *puVar9;
          break;
        case 0x80000001:
          if ((uVar4 & 1) != 0) {
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x40000;
          }
          if ((uVar4 & 0x20) != 0) {
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x2000000000;
          }
          if ((uVar4 & 0x40) != 0) {
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x40000000;
          }
          if ((uVar4 & 0x80) != 0) {
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x200000000;
          }
          if ((uVar4 & 0x100) != 0) {
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x10000;
          }
          if ((uVar4 & 0x200000) != 0) {
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x800000000000000;
          }
          if ((uVar3 & 0x100000) != 0) {
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 4;
          }
          if ((uVar3 & 0x200000) != 0) {
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x100000;
          }
          if ((uVar3 & 0x400000) != 0) {
            local_cd4 = 0x16;
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x400000;
          }
          if ((uVar3 & 0x8000000) != 0) {
            local_ce0 = local_d60;
            local_ce4 = 10;
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x400;
          }
          if ((uVar3 & 0x40000000) != 0) {
            local_cf0 = local_d60;
            local_cf4 = 0x18;
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x1000000;
            local_d00 = local_d60;
            local_d04 = 0x16;
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x400000;
          }
          if ((uVar3 & 0x80000000) != 0) {
            local_d10 = local_d60;
            local_d14 = 0x17;
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x800000;
          }
          if ((*(ulong *)(local_d60 + 6) >> 0x32 & 1) != 0) {
            if ((uVar4 & 0x800) != 0) {
              local_d20 = local_d60;
              local_d24 = 0x37;
              *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x80000000000000;
            }
            if ((uVar4 & 0x10000) != 0) {
              local_d30 = local_d60;
              local_d34 = 0x36;
              *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x40000000000000;
            }
          }
          if ((local_d60[1].field_0._signature == 2) && ((uVar4 & 0x10) != 0)) {
            local_d40 = local_d60;
            local_d44 = 4;
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x10;
          }
          break;
        case 0x80000002:
        case 0x80000003:
        case 0x80000004:
          *local_d90 = *paVar11;
          local_d90[1]._signature = uVar2;
          paVar11 = local_d90 + 3;
          local_d90[2]._signature = uVar4;
          local_d90 = local_d90 + 4;
          paVar11->_signature = uVar3;
          if (local_d64 == 0x80000004) {
            local_d64 = 0x80000007;
          }
          break;
        case 0x80000008:
          if ((uVar2 & 1) != 0) {
            local_d50 = local_d60;
            local_d54 = 0xe;
            *(ulong *)(local_d60 + 6) = *(ulong *)(local_d60 + 6) | 0x4000;
          }
        }
        local_d64 = local_d64 + 1;
      } while (local_d64 <= local_d68);
      local_7a8 = local_d60 + 0xe;
      local_7a9 = '\0';
      local_7aa = (local_7a8->field_0).field_0._type;
      (local_7a8->field_0).field_0._type = '\0';
      local_7a0 = local_7a8;
      while (local_7aa != '\0') {
        if ((local_7aa != ' ') ||
           (((local_7a9 != '@' && ((local_7a0->field_0).field_0._subType != ' ')) &&
            ((local_7a0->field_0).field_0._subType != '@')))) {
          (local_7a8->field_0).field_0._type = local_7aa;
          local_7a8 = (ArchInfo *)((long)&local_7a8->field_0 + 1);
          local_7a9 = local_7aa;
        }
        pAVar10 = (ArchInfo *)((long)&local_7a0->field_0 + 1);
        local_7aa = (local_7a0->field_0).field_0._subType;
        (pAVar10->field_0).field_0._type = '\0';
        local_7a0 = pAVar10;
      }
      (local_7a8->field_0).field_0._type = '\0';
      return;
    }
    if (((local_d60[10].field_0._signature ==
          ((anon_union_4_2_424c626f_for_ArchInfo_0 *)
          (x86GetCpuVendorID(char_const*)::vendorList + (ulong)local_808 * 0x10 + 4))->_signature)
        && (local_d60[0xb].field_0._signature ==
            ((anon_union_4_2_424c626f_for_ArchInfo_0 *)
            (x86GetCpuVendorID(char_const*)::vendorList + (ulong)local_808 * 0x10 + 8))->_signature)
        ) && (local_d60[0xc].field_0._signature ==
              ((anon_union_4_2_424c626f_for_ArchInfo_0 *)
              (x86GetCpuVendorID(char_const*)::vendorList + (ulong)local_808 * 0x10 + 0xc))->
              _signature)) {
      local_7f0 = *(anon_union_4_2_424c626f_for_ArchInfo_0 *)
                   (x86GetCpuVendorID(char_const*)::vendorList + (ulong)local_808 * 0x10);
      goto LAB_0029904c;
    }
    local_808 = local_808 + 1;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE static void x86DetectCpuInfo(CpuInfo* cpuInfo) noexcept {
  uint32_t i, maxId;

  CpuIdResult regs;
  XGetBVResult xcr0 = { 0, 0 };

  cpuInfo->_archInfo.init(ArchInfo::kTypeHost);
  cpuInfo->addFeature(CpuInfo::kX86FeatureI486);

  // --------------------------------------------------------------------------
  // [CPUID EAX=0x0]
  // --------------------------------------------------------------------------

  // Get vendor string/id.
  x86CallCpuId(&regs, 0x0);

  maxId = regs.eax;
  ::memcpy(cpuInfo->_vendorString + 0, &regs.ebx, 4);
  ::memcpy(cpuInfo->_vendorString + 4, &regs.edx, 4);
  ::memcpy(cpuInfo->_vendorString + 8, &regs.ecx, 4);
  cpuInfo->_vendorId = x86GetCpuVendorID(cpuInfo->_vendorString);

  // --------------------------------------------------------------------------
  // [CPUID EAX=0x1]
  // --------------------------------------------------------------------------

  if (maxId >= 0x1) {
    // Get feature flags in ECX/EDX and family/model in EAX.
    x86CallCpuId(&regs, 0x1);

    // Fill family and model fields.
    cpuInfo->_family   = (regs.eax >> 8) & 0x0F;
    cpuInfo->_model    = (regs.eax >> 4) & 0x0F;
    cpuInfo->_stepping = (regs.eax     ) & 0x0F;

    // Use extended family and model fields.
    if (cpuInfo->_family == 0x0F) {
      cpuInfo->_family += ((regs.eax >> 20) & 0xFF);
      cpuInfo->_model  += ((regs.eax >> 16) & 0x0F) << 4;
    }

    cpuInfo->_x86Data._processorType        = ((regs.eax >> 12) & 0x03);
    cpuInfo->_x86Data._brandIndex           = ((regs.ebx      ) & 0xFF);
    cpuInfo->_x86Data._flushCacheLineSize   = ((regs.ebx >>  8) & 0xFF) * 8;
    cpuInfo->_x86Data._maxLogicalProcessors = ((regs.ebx >> 16) & 0xFF);

    if (regs.ecx & 0x00000001U) cpuInfo->addFeature(CpuInfo::kX86FeatureSSE3);
    if (regs.ecx & 0x00000002U) cpuInfo->addFeature(CpuInfo::kX86FeaturePCLMULQDQ);
    if (regs.ecx & 0x00000008U) cpuInfo->addFeature(CpuInfo::kX86FeatureMONITOR);
    if (regs.ecx & 0x00000200U) cpuInfo->addFeature(CpuInfo::kX86FeatureSSSE3);
    if (regs.ecx & 0x00002000U) cpuInfo->addFeature(CpuInfo::kX86FeatureCMPXCHG16B);
    if (regs.ecx & 0x00080000U) cpuInfo->addFeature(CpuInfo::kX86FeatureSSE4_1);
    if (regs.ecx & 0x00100000U) cpuInfo->addFeature(CpuInfo::kX86FeatureSSE4_2);
    if (regs.ecx & 0x00400000U) cpuInfo->addFeature(CpuInfo::kX86FeatureMOVBE);
    if (regs.ecx & 0x00800000U) cpuInfo->addFeature(CpuInfo::kX86FeaturePOPCNT);
    if (regs.ecx & 0x02000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureAESNI);
    if (regs.ecx & 0x04000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureXSAVE);
    if (regs.ecx & 0x08000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureOSXSAVE);
    if (regs.ecx & 0x40000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureRDRAND);
    if (regs.edx & 0x00000010U) cpuInfo->addFeature(CpuInfo::kX86FeatureRDTSC);
    if (regs.edx & 0x00000020U) cpuInfo->addFeature(CpuInfo::kX86FeatureMSR);
    if (regs.edx & 0x00000100U) cpuInfo->addFeature(CpuInfo::kX86FeatureCMPXCHG8B);
    if (regs.edx & 0x00008000U) cpuInfo->addFeature(CpuInfo::kX86FeatureCMOV);
    if (regs.edx & 0x00080000U) cpuInfo->addFeature(CpuInfo::kX86FeatureCLFLUSH);
    if (regs.edx & 0x00800000U) cpuInfo->addFeature(CpuInfo::kX86FeatureMMX);
    if (regs.edx & 0x01000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureFXSR);
    if (regs.edx & 0x02000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureSSE)
                                        .addFeature(CpuInfo::kX86FeatureMMX2);
    if (regs.edx & 0x04000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureSSE)
                                        .addFeature(CpuInfo::kX86FeatureSSE2);
    if (regs.edx & 0x10000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureMT);

    // Get the content of XCR0 if supported by CPU and enabled by OS.
    if ((regs.ecx & 0x0C000000U) == 0x0C000000U) {
      x86CallXGetBV(&xcr0, 0);
    }

    // Detect AVX+.
    if (regs.ecx & 0x10000000U) {
      // - XCR0[2:1] == 11b
      //   XMM & YMM states need to be enabled by OS.
      if ((xcr0.eax & 0x00000006U) == 0x00000006U) {
        cpuInfo->addFeature(CpuInfo::kX86FeatureAVX);

        if (regs.ecx & 0x00001000U) cpuInfo->addFeature(CpuInfo::kX86FeatureFMA);
        if (regs.ecx & 0x20000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureF16C);
      }
    }
  }

  // --------------------------------------------------------------------------
  // [CPUID EAX=0x7]
  // --------------------------------------------------------------------------

  // Detect new features if the processor supports CPUID-07.
  bool maybeMPX = false;

  if (maxId >= 0x7) {
    x86CallCpuId(&regs, 0x7);

    if (regs.ebx & 0x00000001U) cpuInfo->addFeature(CpuInfo::kX86FeatureFSGSBASE);
    if (regs.ebx & 0x00000008U) cpuInfo->addFeature(CpuInfo::kX86FeatureBMI);
    if (regs.ebx & 0x00000010U) cpuInfo->addFeature(CpuInfo::kX86FeatureHLE);
    if (regs.ebx & 0x00000080U) cpuInfo->addFeature(CpuInfo::kX86FeatureSMEP);
    if (regs.ebx & 0x00000100U) cpuInfo->addFeature(CpuInfo::kX86FeatureBMI2);
    if (regs.ebx & 0x00000200U) cpuInfo->addFeature(CpuInfo::kX86FeatureERMS);
    if (regs.ebx & 0x00000800U) cpuInfo->addFeature(CpuInfo::kX86FeatureRTM);
    if (regs.ebx & 0x00004000U) maybeMPX = true;
    if (regs.ebx & 0x00040000U) cpuInfo->addFeature(CpuInfo::kX86FeatureRDSEED);
    if (regs.ebx & 0x00080000U) cpuInfo->addFeature(CpuInfo::kX86FeatureADX);
    if (regs.ebx & 0x00100000U) cpuInfo->addFeature(CpuInfo::kX86FeatureSMAP);
    if (regs.ebx & 0x00400000U) cpuInfo->addFeature(CpuInfo::kX86FeaturePCOMMIT);
    if (regs.ebx & 0x00800000U) cpuInfo->addFeature(CpuInfo::kX86FeatureCLFLUSHOPT);
    if (regs.ebx & 0x01000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureCLWB);
    if (regs.ebx & 0x20000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureSHA);
    if (regs.ecx & 0x00000001U) cpuInfo->addFeature(CpuInfo::kX86FeaturePREFETCHWT1);

    // TSX is supported if at least one of `HLE` and `RTM` is supported.
    if (regs.ebx & 0x00000810U) cpuInfo->addFeature(CpuInfo::kX86FeatureTSX);

    // Detect AVX2.
    if (cpuInfo->hasFeature(CpuInfo::kX86FeatureAVX)) {
      if (regs.ebx & 0x00000020U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX2);
    }

    // Detect AVX-512+.
    if (regs.ebx & 0x00010000U) {
      // - XCR0[2:1] == 11b
      //   XMM/YMM states need to be enabled by OS.
      // - XCR0[7:5] == 111b
      //   Upper 256-bit of ZMM0-XMM15 and ZMM16-ZMM31 need to be enabled by the OS.
      if ((xcr0.eax & 0x000000E6U) == 0x000000E6U) {
        cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_F);

        if (regs.ebx & 0x00020000U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_DQ);
        if (regs.ebx & 0x00200000U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_IFMA);
        if (regs.ebx & 0x04000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_PFI);
        if (regs.ebx & 0x08000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_ERI);
        if (regs.ebx & 0x10000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_CDI);
        if (regs.ebx & 0x40000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_BW);
        if (regs.ebx & 0x80000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_VL);
        if (regs.ecx & 0x00000002U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_VBMI);
        if (regs.ecx & 0x00004000U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_VPOPCNTDQ);
        if (regs.edx & 0x00000004U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_4VNNIW);
        if (regs.edx & 0x00000008U) cpuInfo->addFeature(CpuInfo::kX86FeatureAVX512_4FMAPS);
      }
    }
  }

  // --------------------------------------------------------------------------
  // [CPUID EAX=0xD]
  // --------------------------------------------------------------------------

  if (maxId >= 0xD) {
    x86CallCpuId(&regs, 0xD, 0);

    // Both CPUID result and XCR0 has to be enabled to have support for MPX.
    if (((regs.eax & xcr0.eax) & 0x00000018U) == 0x00000018U && maybeMPX)
      cpuInfo->addFeature(CpuInfo::kX86FeatureMPX);

    x86CallCpuId(&regs, 0xD, 1);
    if (regs.eax & 0x00000001U) cpuInfo->addFeature(CpuInfo::kX86FeatureXSAVEOPT);
    if (regs.eax & 0x00000002U) cpuInfo->addFeature(CpuInfo::kX86FeatureXSAVEC);
    if (regs.eax & 0x00000008U) cpuInfo->addFeature(CpuInfo::kX86FeatureXSAVES);
  }

  // --------------------------------------------------------------------------
  // [CPUID EAX=0x80000000...maxId]
  // --------------------------------------------------------------------------

  // The highest EAX that we understand.
  uint32_t kHighestProcessedEAX = 0x80000008U;

  // Several CPUID calls are required to get the whole branc string. It's easy
  // to copy one DWORD at a time instead of performing a byte copy.
  uint32_t* brand = reinterpret_cast<uint32_t*>(cpuInfo->_brandString);

  i = maxId = 0x80000000U;
  do {
    x86CallCpuId(&regs, i);
    switch (i) {
      case 0x80000000U:
        maxId = std::min<uint32_t>(regs.eax, kHighestProcessedEAX);
        break;

      case 0x80000001U:
        if (regs.ecx & 0x00000001U) cpuInfo->addFeature(CpuInfo::kX86FeatureLAHFSAHF);
        if (regs.ecx & 0x00000020U) cpuInfo->addFeature(CpuInfo::kX86FeatureLZCNT);
        if (regs.ecx & 0x00000040U) cpuInfo->addFeature(CpuInfo::kX86FeatureSSE4A);
        if (regs.ecx & 0x00000080U) cpuInfo->addFeature(CpuInfo::kX86FeatureMSSE);
        if (regs.ecx & 0x00000100U) cpuInfo->addFeature(CpuInfo::kX86FeaturePREFETCHW);
        if (regs.ecx & 0x00200000U) cpuInfo->addFeature(CpuInfo::kX86FeatureTBM);
        if (regs.edx & 0x00100000U) cpuInfo->addFeature(CpuInfo::kX86FeatureNX);
        if (regs.edx & 0x00200000U) cpuInfo->addFeature(CpuInfo::kX86FeatureFXSROPT);
        if (regs.edx & 0x00400000U) cpuInfo->addFeature(CpuInfo::kX86FeatureMMX2);
        if (regs.edx & 0x08000000U) cpuInfo->addFeature(CpuInfo::kX86FeatureRDTSCP);
        if (regs.edx & 0x40000000U) cpuInfo->addFeature(CpuInfo::kX86Feature3DNOW2)
                                            .addFeature(CpuInfo::kX86FeatureMMX2);
        if (regs.edx & 0x80000000U) cpuInfo->addFeature(CpuInfo::kX86Feature3DNOW);

        if (cpuInfo->hasFeature(CpuInfo::kX86FeatureAVX)) {
          if (regs.ecx & 0x00000800U) cpuInfo->addFeature(CpuInfo::kX86FeatureXOP);
          if (regs.ecx & 0x00010000U) cpuInfo->addFeature(CpuInfo::kX86FeatureFMA4);
        }

        // These seem to be only supported by AMD.
        if (cpuInfo->getVendorId() == CpuInfo::kVendorAMD) {
          if (regs.ecx & 0x00000010U) cpuInfo->addFeature(CpuInfo::kX86FeatureALTMOVCR8);
        }
        break;

      case 0x80000002U:
      case 0x80000003U:
      case 0x80000004U:
        *brand++ = regs.eax;
        *brand++ = regs.ebx;
        *brand++ = regs.ecx;
        *brand++ = regs.edx;

        // Go directly to the last one.
        if (i == 0x80000004U) i = 0x80000008U - 1;
        break;

      case 0x80000008U:
        if (regs.ebx & 0x00000001U) cpuInfo->addFeature(CpuInfo::kX86FeatureCLZERO);
        break;
    }
  } while (++i <= maxId);

  // Simplify CPU brand string by removing unnecessary spaces.
  x86SimplifyBrandString(cpuInfo->_brandString);
}